

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  nk_plugin_alloc p_Var1;
  uchar *puVar2;
  long lVar3;
  ulong uVar4;
  nk_font *pnVar5;
  ulong uVar6;
  uchar *puVar7;
  byte bVar8;
  uint uVar9;
  nk_font_config *pnVar10;
  ushort *puVar11;
  ushort *puVar12;
  uint uVar13;
  ulong uVar15;
  byte bVar16;
  nk_font_config local_88;
  ulong uVar14;
  
  bVar16 = 0;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3549,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x354a,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x354b,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  p_Var1 = (atlas->permanent).alloc;
  if (p_Var1 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x354c,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x354d,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_data == (void *)0x0) {
    __assert_fail("compressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x354f,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_size == 0) {
    __assert_fail("compressed_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3550,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar13 = *(uint *)((long)compressed_data + 8);
  uVar15 = (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                  uVar13 << 0x18);
  puVar2 = (uchar *)(*p_Var1)((atlas->permanent).userdata,(void *)0x0,uVar15);
  if (puVar2 == (uchar *)0x0) {
    __assert_fail("decompressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3557,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar13 = *compressed_data;
  if (((uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18) !=
       0x57bc0000) ||
     (uVar13 = *(uint *)((long)compressed_data + 4),
     ((uVar13 >> 0x18 != 0 || (uVar13 & 0xff0000) != 0) || (uVar13 & 0xff00) != 0) ||
     (uVar13 & 0xff) != 0)) {
LAB_0010e4bf:
    if (config == (nk_font_config *)0x0) {
      local_88.padding[2] = '\0';
      local_88.padding[0] = '\0';
      local_88.padding[1] = '\0';
      local_88.next = (nk_font_config *)0x0;
      local_88.merge_mode = '\0';
      local_88.pixel_snap = '\0';
      local_88.oversample_v = '\x01';
      local_88.oversample_h = '\x03';
      local_88.coord_type = NK_COORD_UV;
      local_88.spacing.x = 0.0;
      local_88.spacing.y = 0.0;
      local_88.range = nk_font_default_glyph_ranges::ranges;
      local_88.font = (nk_baked_font *)0x0;
      local_88.fallback_glyph = 0x3f;
      local_88._68_8_ = 0;
      local_88._76_8_ = 0;
      local_88.p._4_4_ = 0;
    }
    else {
      pnVar10 = &local_88;
      for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
        pnVar10->next = config->next;
        config = (nk_font_config *)((long)config + (ulong)bVar16 * -0x10 + 8);
        pnVar10 = (nk_font_config *)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 8);
      }
    }
    local_88.ttf_data_owned_by_atlas = '\x01';
    local_88.ttf_blob = puVar2;
    local_88.ttf_size = uVar15;
    local_88.size = height;
    pnVar5 = nk_font_atlas_add(atlas,&local_88);
    return pnVar5;
  }
  uVar13 = *(uint *)((long)compressed_data + 8);
  uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  uVar14 = (ulong)uVar13;
  nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
  puVar7 = puVar2 + uVar14;
  puVar11 = (ushort *)((long)compressed_data + 0x10);
  nk__barrier2 = (uchar *)compressed_data;
  nk__barrier = puVar7;
  nk__barrier4 = puVar2;
  nk__dout = puVar2;
  do {
    bVar8 = (byte)*puVar11;
    uVar9 = (uint)bVar8;
    if (bVar8 < 0x20) {
      if (bVar8 < 0x18) {
        if (bVar8 < 0x10) {
          if (bVar8 < 8) {
            if (bVar8 != 4) {
              if (uVar9 == 6) {
                uVar4 = ~((ulong)*(byte *)((long)puVar11 + 3) |
                          (ulong)*(byte *)((long)puVar11 + 1) << 0x10 | (ulong)(byte)puVar11[1] << 8
                         );
                uVar9 = (uint)(byte)puVar11[2];
                goto LAB_0010e312;
              }
              if (uVar9 == 7) {
                nk__lit((byte *)((long)puVar11 + 3),
                        (ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                *(ushort *)((long)puVar11 + 1) >> 8) + 1);
                uVar4 = (ulong)(ushort)(*(ushort *)((long)puVar11 + 1) << 8 |
                                       *(ushort *)((long)puVar11 + 1) >> 8);
                lVar3 = 4;
                goto LAB_0010e3ce;
              }
              goto LAB_0010e461;
            }
            nk__match(nk__dout +
                      ~((ulong)*(byte *)((long)puVar11 + 3) |
                        (ulong)*(byte *)((long)puVar11 + 1) << 0x10 | (ulong)(byte)puVar11[1] << 8),
                      (ushort)(puVar11[2] << 8 | puVar11[2] >> 8) + 1);
            puVar12 = puVar11 + 3;
          }
          else {
            nk__lit((uchar *)(puVar11 + 1),
                    ((uint)bVar8 * 0x100 + (uint)*(byte *)((long)puVar11 + 1)) - 0x7ff);
            uVar4 = (ulong)(ushort)(*puVar11 << 8 | *puVar11 >> 8);
            lVar3 = -0x7fd;
LAB_0010e3ce:
            puVar12 = (ushort *)((long)puVar11 + uVar4 + lVar3);
            if (puVar12 == puVar11) {
              bVar8 = (byte)*puVar11;
LAB_0010e461:
              if ((bVar8 != 5) || (*(byte *)((long)puVar11 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                              ,0x3441,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (nk__dout != puVar7) {
                __assert_fail("nk__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                              ,0x343b,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (uVar13 != 0) {
                uVar4 = (ulong)(uVar13 % 0x15b0);
                do {
                  if (7 < uVar4) {
                    uVar6 = 7;
                    do {
                      uVar6 = uVar6 + 8;
                    } while (uVar6 < uVar4);
                  }
                  uVar13 = (int)uVar14 - (int)uVar4;
                  uVar14 = (ulong)uVar13;
                  uVar4 = 0x15b0;
                } while (uVar13 != 0);
              }
              goto LAB_0010e4bf;
            }
          }
        }
        else {
          uVar4 = -(ulong)(((uint)*(byte *)((long)puVar11 + 1) * 0x100 +
                           ((uint)(byte)puVar11[1] | (uint)bVar8 << 0x10)) - 0xfffff);
          uVar9 = (uint)(ushort)(*(ushort *)((long)puVar11 + 3) << 8 |
                                *(ushort *)((long)puVar11 + 3) >> 8);
LAB_0010e312:
          nk__match(nk__dout + uVar4,uVar9 + 1);
          puVar12 = (ushort *)((long)puVar11 + 5);
        }
      }
      else {
        nk__match(nk__dout +
                  -(ulong)(((uint)*(byte *)((long)puVar11 + 1) * 0x100 +
                           ((uint)(byte)puVar11[1] | (uint)bVar8 << 0x10)) - 0x17ffff),
                  *(byte *)((long)puVar11 + 3) + 1);
        puVar12 = puVar11 + 2;
      }
    }
    else if ((char)bVar8 < '\0') {
      nk__match(nk__dout + ~(ulong)*(byte *)((long)puVar11 + 1),uVar9 - 0x7f);
      puVar12 = puVar11 + 1;
    }
    else {
      if (bVar8 < 0x40) {
        nk__lit((byte *)((long)puVar11 + 1),uVar9 - 0x1f);
        uVar4 = (ulong)(byte)*puVar11;
        lVar3 = -0x1e;
        goto LAB_0010e3ce;
      }
      nk__match(nk__dout +
                -(ulong)(((uint)*(byte *)((long)puVar11 + 1) + (uint)bVar8 * 0x100) - 0x3fff),
                (byte)puVar11[1] + 1);
      puVar12 = (ushort *)((long)puVar11 + 3);
    }
    puVar11 = puVar12;
    if (puVar7 < nk__dout) {
      __assert_fail("nk__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x3445,
                    "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
    void *compressed_data, nk_size compressed_size, float height,
    const struct nk_font_config *config)
{
    unsigned int decompressed_size;
    void *decompressed_data;
    struct nk_font_config cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(compressed_data);
    NK_ASSERT(compressed_size);
    if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
    decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
    NK_ASSERT(decompressed_data);
    if (!decompressed_data) return 0;
    nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
        (unsigned int)compressed_size);

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = decompressed_data;
    cfg.ttf_size = decompressed_size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 1;
    return nk_font_atlas_add(atlas, &cfg);
}